

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnLoop(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  pointer pTVar1;
  Result RVar2;
  pointer pTVar3;
  LabelType local_2c;
  unsigned_long local_28;
  
  RVar2 = PopAndCheckSignature(this,param_types,"loop");
  local_2c = Loop;
  local_28 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_2c,param_types,result_types,&local_28);
  pTVar1 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    PushType(this,(Type)pTVar3->enum_);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnLoop(const TypeVector& param_types,
                           const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "loop");
  PushLabel(LabelType::Loop, param_types, result_types);
  PushTypes(param_types);
  return result;
}